

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::Canceler::AdapterBase::AdapterBase(AdapterBase *this,Canceler *canceler)

{
  AdapterBase *pAVar1;
  AdapterBase *n;
  
  this->_vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_00708950;
  (this->prev).ptr = &canceler->list;
  (this->next).ptr = (canceler->list).ptr;
  (canceler->list).ptr = this;
  pAVar1 = (this->next).ptr;
  if (pAVar1 != (AdapterBase *)0x0) {
    (pAVar1->prev).ptr = &this->next;
  }
  return;
}

Assistant:

Canceler::AdapterBase::AdapterBase(Canceler& canceler)
    : prev(canceler.list),
      next(canceler.list) {
  canceler.list = *this;
  KJ_IF_SOME(n, next) {
    n.prev = next;
  }
}